

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_video.cpp
# Opt level: O2

void __thiscall FPaletteTester::MakeTexture(FPaletteTester *this)

{
  uint uVar1;
  BYTE *pBVar2;
  long lVar3;
  int iVar4;
  long lVar5;
  int iVar6;
  BYTE BVar7;
  
  uVar1 = this->WantTranslation;
  pBVar2 = this->Pixels;
  lVar3 = 0;
  for (iVar4 = 0; iVar4 != 0x10; iVar4 = iVar4 + 1) {
    lVar5 = (long)(int)lVar3 + -0xff;
    for (iVar6 = 0; iVar6 != 0x100; iVar6 = iVar6 + 0x10) {
      if ((int)uVar1 < 2) {
        BVar7 = (char)lVar3 + (char)iVar6;
      }
      else {
        BVar7 = (translationtables[3].super_TArray<FRemapTablePtr,_FRemapTable_*>.Array
                 [(ulong)uVar1 - 2].Ptr)->Remap[lVar5 + 0xff];
      }
      *pBVar2 = BVar7;
      pBVar2 = pBVar2 + 1;
      lVar5 = lVar5 + 0x10;
    }
    lVar3 = lVar5;
  }
  this->CurTranslation = uVar1;
  return;
}

Assistant:

void FPaletteTester::MakeTexture()
{
	int i, j, k, t;
	BYTE *p;

	t = WantTranslation;
	p = Pixels;
	k = 0;
	for (i = 0; i < 16; ++i)
	{
		for (j = 0; j < 16; ++j)
		{
			*p++ = (t > 1) ? translationtables[TRANSLATION_Standard][t - 2]->Remap[k] : k;
			k += 16;
		}
		k -= 255;
	}
	CurTranslation = t;
}